

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O3

int send_client_hello(ptls_t *tls,ptls_message_emitter_t *emitter,
                     ptls_handshake_properties_t *properties,ptls_iovec_t *cookie)

{
  ptls_esni_secret_t **esni;
  ptls_key_exchange_context_t **pppVar1;
  byte bVar2;
  ushort uVar3;
  ushort uVar4;
  ptls_key_schedule_t *ppVar5;
  ptls_context_t *ppVar6;
  size_t *psVar7;
  ptls_buffer_t *buf;
  ptls_buffer_t *buf_00;
  st_ptls_key_exchange_algorithm_t *psVar8;
  st_ptls_update_esni_key_t *psVar9;
  ptls_iovec_t *ppVar10;
  ptls_key_exchange_algorithm_t *ppVar11;
  ptls_hash_algorithm_t *algo;
  undefined8 uVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  ptls_iovec_t hash_value;
  ptls_iovec_t pVar15;
  int iVar16;
  ptls_early_data_acceptance_t pVar17;
  uint uVar18;
  ptls_esni_secret_t *ppVar19;
  ptls_cipher_suite_t **pppVar20;
  uint8_t *puVar21;
  size_t sVar22;
  ptls_key_schedule_t *ppVar23;
  ptls_hash_context_t *ppVar24;
  ulong uVar25;
  uint64_t uVar26;
  size_t sVar27;
  ptls_cipher_suite_t *ppVar28;
  char *server_name;
  ptls_key_exchange_algorithm_t **pppVar29;
  size_t sVar30;
  ushort *end;
  long lVar31;
  uint8_t *puVar32;
  ptls_hash_context_t **pppVar33;
  size_t sVar34;
  uint16_t *puVar35;
  ushort *puVar36;
  uint8_t *in_R9;
  size_t len;
  ushort *puVar37;
  uint16_t uVar38;
  ulong uVar39;
  ushort *puVar40;
  size_t sVar41;
  bool bVar42;
  ptls_iovec_t secret;
  ptls_iovec_t ikm;
  ptls_iovec_t esni_keys;
  size_t in_stack_fffffffffffffeb8;
  char *local_140;
  anon_struct_104_5_dae46d3e_for_client *local_120;
  ptls_key_exchange_algorithm_t **local_118;
  ushort *local_110;
  uint32_t _v;
  ushort *local_f0;
  size_t local_e8;
  ptls_cipher_suite_t **local_e0;
  anon_struct_104_5_dae46d3e_for_client *local_d8;
  ptls_iovec_t *local_d0;
  size_t local_c8;
  size_t local_c0;
  uint8_t *local_b8;
  uint64_t not_before;
  uint32_t max_early_data_size;
  uint32_t age_add;
  ptls_iovec_t resumption_ticket;
  uint64_t not_after;
  size_t local_88;
  size_t local_80;
  uint8_t binder_key [64];
  
  ppVar5 = tls->key_schedule;
  local_d0 = cookie;
  if (tls->server_name == (char *)0x0) {
    bVar42 = false;
  }
  else {
    iVar16 = ptls_server_name_is_ipaddr(tls->server_name);
    bVar42 = iVar16 == 0;
  }
  if (properties == (ptls_handshake_properties_t *)0x0) {
    uVar18 = 0;
    local_140 = (char *)0x0;
    uVar39 = 0;
    local_110 = (ushort *)0x0;
    if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
LAB_00109705:
      tls->key_share = *tls->ctx->key_exchanges;
    }
    goto LAB_00109716;
  }
  if ((!(bool)(ppVar5 == (ptls_key_schedule_t *)0x0 & bVar42)) ||
     (puVar40 = (ushort *)(properties->field_0).client.esni_keys.base, puVar40 == (ushort *)0x0)) {
    local_140 = (char *)0x0;
    goto LAB_001095cf;
  }
  ppVar6 = tls->ctx;
  uVar39 = (properties->field_0).client.esni_keys.len;
  ppVar19 = (ptls_esni_secret_t *)calloc(1,0xd0);
  tls->esni = ppVar19;
  if (ppVar19 != (ptls_esni_secret_t *)0x0) {
    esni = &tls->esni;
    if (((1 < (long)uVar39) && ((ushort)(*puVar40 << 8 | *puVar40 >> 8) == 0xff02)) && (5 < uVar39))
    {
      pppVar20 = ppVar6->cipher_suites;
      ppVar28 = *pppVar20;
      if (ppVar28 != (ptls_cipher_suite_t *)0x0) {
        local_b8 = tls->client_random;
        local_d8 = &ppVar19->client;
        local_e0 = &(ppVar19->client).cipher;
        end = (ushort *)(uVar39 + (long)puVar40);
        do {
          pppVar20 = pppVar20 + 1;
          if ((ppVar28->id | 2) == 0x1303) {
            ppVar24 = (*ppVar28->hash->create)();
            if (ppVar24 != (ptls_hash_context_t *)0x0) {
              (*ppVar24->update)(ppVar24,puVar40,2);
              (*ppVar24->update)(ppVar24,"",4);
              (*ppVar24->update)(ppVar24,puVar40 + 3);
              (*ppVar24->final)(ppVar24,binder_key,PTLS_HASH_FINAL_MODE_FREE);
              if (((*(int *)(puVar40 + 1) == binder_key._0_4_) &&
                  (ppVar19->version = 0xff02, 1 < uVar39 - 6)) &&
                 (uVar25 = (ulong)(ushort)(puVar40[3] << 8 | puVar40[3] >> 8), uVar25 <= uVar39 - 8)
                 ) {
                local_140 = (char *)malloc(uVar25 + 1);
                if (local_140 == (char *)0x0) {
                  local_140 = (char *)0x0;
                  goto LAB_00109da0;
                }
                puVar36 = (ushort *)((long)(puVar40 + 4) + uVar25);
                if (uVar25 != 0) {
                  memcpy(local_140,puVar40 + 4,uVar25);
                }
                local_140[uVar25] = '\0';
                if ((ulong)((long)end - (long)puVar36) < 2) goto LAB_00109da0;
                uVar25 = (ulong)(ushort)(*puVar36 << 8 | *puVar36 >> 8);
                local_f0 = puVar36 + 1;
                if ((ulong)((long)end - (long)local_f0) < uVar25) goto LAB_00109da0;
                puVar36 = (ushort *)((long)local_f0 + uVar25);
                in_R9 = (uint8_t *)0x0;
                iVar16 = select_key_share(&local_d8->key_share,&resumption_ticket,
                                          ppVar6->key_exchanges,(uint8_t **)&local_f0,
                                          (uint8_t *)puVar36,0);
                if (((iVar16 != 0) || (local_f0 != puVar36)) ||
                   ((ulong)((long)end - (long)puVar36) < 2)) goto LAB_00109da0;
                uVar25 = (ulong)(ushort)(*local_f0 << 8 | *local_f0 >> 8);
                puVar36 = local_f0 + 1;
                if ((ulong)((long)end - (long)puVar36) < uVar25) goto LAB_00109da0;
                puVar37 = (ushort *)(uVar25 + (long)puVar36);
                iVar16 = select_cipher(local_e0,ppVar6->cipher_suites,(uint8_t *)puVar36,
                                       (uint8_t *)puVar37);
                if ((iVar16 != 0) || ((long)end - (long)puVar37 < 2)) goto LAB_00109da0;
                (ppVar19->client).padded_length = *puVar37 << 8 | *puVar37 >> 8;
                local_f0 = puVar37 + 1;
                iVar16 = ptls_decode64(&not_before,(uint8_t **)&local_f0,(uint8_t *)end);
                if ((iVar16 != 0) ||
                   ((iVar16 = ptls_decode64(&not_after,(uint8_t **)&local_f0,(uint8_t *)end),
                    iVar16 != 0 || ((ulong)((long)end - (long)local_f0) < 2)))) goto LAB_00109da0;
                uVar25 = (ulong)(ushort)(*local_f0 << 8 | *local_f0 >> 8);
                puVar36 = local_f0 + 1;
                if ((ulong)((long)end - (long)puVar36) < uVar25) goto LAB_00109da0;
                puVar37 = puVar36;
                if (uVar25 == 0) goto LAB_0010a0d9;
                puVar37 = (ushort *)(uVar25 + (long)puVar36);
                goto LAB_0010a092;
              }
            }
            break;
          }
          ppVar28 = *pppVar20;
        } while (ppVar28 != (ptls_cipher_suite_t *)0x0);
      }
    }
    local_140 = (char *)0x0;
    goto LAB_00109da0;
  }
  iVar16 = 0x201;
  local_140 = (char *)0x0;
LAB_00109bd7:
  if (local_140 == (char *)0x0) goto LAB_00109be1;
  goto LAB_00109bdc;
joined_r0x00109e00:
  if (ppVar28 == (ptls_cipher_suite_t *)0x0) goto LAB_00109670;
  pppVar20 = pppVar20 + 1;
  if (ppVar28->id == (uint16_t)(uVar4 << 8 | uVar4 >> 8)) {
    uVar26 = (*ppVar6->get_time->cb)(ppVar6->get_time);
    if ((not_before <= uVar26) && (uVar26 - not_before < 0x240c8400)) {
      bVar2 = (tls->field_18).server.pending_traffic_secret[0x38];
      uVar18 = (int)(uVar26 - not_before) + age_add;
      (tls->field_18).server.pending_traffic_secret[0x38] = bVar2 | 1;
      if (tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) {
        tls->key_share = ppVar11;
      }
      tls->cipher_suite = ppVar28;
      if ((max_early_data_size != 0 && ppVar5 == (ptls_key_schedule_t *)0x0) &&
         ((properties->field_0).client.max_early_data_size != (size_t *)0x0)) {
        (tls->field_18).server.pending_traffic_secret[0x38] = bVar2 | 3;
        *(properties->field_0).client.max_early_data_size = (ulong)max_early_data_size;
      }
      goto LAB_001096c5;
    }
    goto LAB_00109670;
  }
  ppVar28 = *pppVar20;
  goto joined_r0x00109e00;
  while( true ) {
    uVar25 = (ulong)(ushort)(puVar36[1] << 8 | puVar36[1] >> 8);
    if ((ulong)((long)puVar37 - (long)(puVar36 + 2)) < uVar25) goto LAB_00109da0;
    puVar36 = (ushort *)((long)(puVar36 + 2) + uVar25);
    if (puVar36 == puVar37) break;
LAB_0010a092:
    if (((long)puVar37 - (long)puVar36 < 2) || (((long)puVar37 - (long)puVar36) - 2U < 2))
    goto LAB_00109da0;
  }
LAB_0010a0d9:
  if (((puVar37 == end) &&
      (uVar26 = (*ppVar6->get_time->cb)(ppVar6->get_time),
      not_before * 1000 < uVar26 || not_before * 1000 - uVar26 == 0)) &&
     (uVar26 <= not_after * 1000)) {
    (*ppVar6->random_bytes)((*esni)->nonce,0x10);
    ppVar19 = *esni;
    ppVar24 = (*((ppVar19->client).cipher)->hash->create)();
    if (ppVar24 == (ptls_hash_context_t *)0x0) {
      iVar16 = 0x201;
    }
    else {
      (*ppVar24->update)(ppVar24,puVar40,uVar39);
      (*ppVar24->final)(ppVar24,(ppVar19->client).record_digest,PTLS_HASH_FINAL_MODE_FREE);
      ppVar19 = *esni;
      psVar8 = (ppVar19->client).key_share;
      pVar15.len = resumption_ticket.len;
      pVar15.base = resumption_ticket.base;
      iVar16 = (*psVar8->exchange)(psVar8,&(ppVar19->client).pubkey,&ppVar19->secret,pVar15);
      if (iVar16 == 0) {
        ppVar19 = *esni;
        in_R9 = (uint8_t *)(ppVar19->client).pubkey.len;
        iVar16 = build_esni_contents_hash
                           (((ppVar19->client).cipher)->hash,ppVar19->esni_contents_hash,
                            (ppVar19->client).record_digest,((ppVar19->client).key_share)->id,
                            (ppVar19->client).pubkey,local_b8);
        if (iVar16 == 0) goto LAB_00109db2;
      }
    }
    free_esni_secret(esni,0);
    goto LAB_00109bd7;
  }
LAB_00109da0:
  free(*esni);
  *esni = (ptls_esni_secret_t *)0x0;
LAB_00109db2:
  psVar9 = tls->ctx->update_esni_key;
  if (psVar9 != (st_ptls_update_esni_key_t *)0x0) {
    ppVar19 = tls->esni;
    in_R9 = ppVar19->esni_contents_hash;
    iVar16 = (*psVar9->cb)(psVar9,tls,ppVar19->secret,((ppVar19->client).cipher)->hash,in_R9);
    if (iVar16 != 0) goto LAB_00109bd7;
  }
LAB_001095cf:
  uVar18 = 0;
  puVar40 = (ushort *)(properties->field_0).client.session_ticket.base;
  if (puVar40 == (ushort *)0x0) {
    uVar39 = 0;
    local_110 = (ushort *)0x0;
  }
  else {
    puVar32 = (uint8_t *)((properties->field_0).client.session_ticket.len + (long)puVar40);
    local_f0 = puVar40;
    iVar16 = ptls_decode64(&not_before,(uint8_t **)&local_f0,puVar32);
    if (((iVar16 == 0) && (1 < (long)puVar32 - (long)local_f0)) &&
       ((1 < ((long)puVar32 - (long)local_f0) + -2 &&
        (2 < (ulong)((long)puVar32 - (long)(local_f0 + 2)))))) {
      uVar3 = *local_f0;
      uVar4 = local_f0[1];
      lVar31 = 0;
      uVar39 = 0;
      do {
        uVar39 = (ulong)*(byte *)((long)(local_f0 + 2) + lVar31) | uVar39 << 8;
        lVar31 = lVar31 + 1;
      } while (lVar31 != 3);
      puVar21 = (uint8_t *)((long)local_f0 + 7);
      if (uVar39 <= (ulong)((long)puVar32 - (long)puVar21)) {
        puVar40 = (ushort *)(puVar21 + uVar39);
        in_R9 = (uint8_t *)&max_early_data_size;
        iVar16 = decode_new_session_ticket
                           (tls,(uint32_t *)&not_after,&age_add,(ptls_iovec_t *)binder_key,
                            &resumption_ticket,(uint32_t *)in_R9,puVar21,(uint8_t *)puVar40);
        if ((1 < (ulong)((long)puVar32 - (long)puVar40)) && (iVar16 == 0)) {
          uVar39 = (ulong)(ushort)(*puVar40 << 8 | *puVar40 >> 8);
          local_110 = puVar40 + 1;
          if ((uint8_t *)((long)puVar40 + uVar39 + 2) == puVar32 &&
              uVar39 <= (ulong)((long)puVar32 - (long)local_110)) {
            ppVar6 = tls->ctx;
            pppVar29 = ppVar6->key_exchanges;
            ppVar11 = *pppVar29;
            while (ppVar11 != (ptls_key_exchange_algorithm_t *)0x0) {
              pppVar29 = pppVar29 + 1;
              if (ppVar11->id == (uint16_t)(uVar3 << 8 | uVar3 >> 8)) {
                pppVar20 = ppVar6->cipher_suites;
                ppVar28 = *pppVar20;
                goto joined_r0x00109e00;
              }
              ppVar11 = *pppVar29;
            }
          }
        }
      }
    }
LAB_00109670:
    uVar18 = 0;
    uVar39 = 0;
    local_110 = (ushort *)0x0;
  }
LAB_001096c5:
  pVar17 = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
  if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) == 0) {
    psVar7 = (properties->field_0).client.max_early_data_size;
    pVar17 = PTLS_EARLY_DATA_REJECTED;
    if (psVar7 != (size_t *)0x0) {
      *psVar7 = 0;
    }
  }
  (properties->field_0).client.early_data_acceptance = pVar17;
  if ((tls->key_share == (ptls_key_exchange_algorithm_t *)0x0) &&
     (((properties->field_0).server.selected_psk_binder.base[0x2c] & 1) == 0)) goto LAB_00109705;
LAB_00109716:
  local_118 = &tls->key_share;
  if (ppVar5 == (ptls_key_schedule_t *)0x0) {
    ppVar23 = key_schedule_new(tls->cipher_suite,tls->ctx->cipher_suites,
                               tls->ctx->hkdf_label_prefix__obsolete);
    tls->key_schedule = ppVar23;
    ikm.len = uVar39;
    ikm.base = (uint8_t *)local_110;
    iVar16 = key_schedule_extract(ppVar23,ikm);
    if (iVar16 != 0) goto LAB_00109bd7;
  }
  sVar22 = emitter->record_header_length;
  sVar34 = emitter->buf->off;
  iVar16 = (*emitter->begin_message)(emitter);
  if (iVar16 != 0) goto LAB_00109bd7;
  buf = emitter->buf;
  local_d8 = (anon_struct_104_5_dae46d3e_for_client *)(sVar22 + sVar34);
  iVar16 = ptls_buffer_reserve(buf,1);
  if (iVar16 != 0) goto LAB_00109bd7;
  buf->base[buf->off] = '\x01';
  buf->off = buf->off + 1;
  iVar16 = ptls_buffer_reserve(buf,3);
  if (iVar16 != 0) goto LAB_00109bd7;
  puVar32 = buf->base;
  sVar22 = buf->off;
  puVar32[sVar22 + 2] = '\0';
  puVar32 = puVar32 + sVar22;
  puVar32[0] = '\0';
  puVar32[1] = '\0';
  local_e0 = (ptls_cipher_suite_t **)buf->off;
  puVar32 = (uint8_t *)((long)local_e0 + 3);
  buf->off = (size_t)puVar32;
  buf_00 = emitter->buf;
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 != 0) goto LAB_00109bd7;
  puVar21 = buf_00->base;
  sVar22 = buf_00->off;
  (puVar21 + sVar22)[0] = '\x03';
  (puVar21 + sVar22)[1] = '\x03';
  buf_00->off = buf_00->off + 2;
  local_b8 = puVar32;
  iVar16 = ptls_buffer_reserve(buf_00,0x20);
  if (iVar16 != 0) goto LAB_00109bd7;
  puVar32 = buf_00->base;
  sVar22 = buf_00->off;
  uVar12 = *(undefined8 *)tls->client_random;
  uVar13 = *(undefined8 *)(tls->client_random + 8);
  uVar14 = *(undefined8 *)(tls->client_random + 0x18);
  puVar21 = puVar32 + sVar22 + 0x10;
  *(undefined8 *)puVar21 = *(undefined8 *)(tls->client_random + 0x10);
  *(undefined8 *)(puVar21 + 8) = uVar14;
  puVar32 = puVar32 + sVar22;
  *(undefined8 *)puVar32 = uVar12;
  *(undefined8 *)(puVar32 + 8) = uVar13;
  buf_00->off = buf_00->off + 0x20;
  iVar16 = ptls_buffer_reserve(buf_00,1);
  if (iVar16 != 0) goto LAB_00109bd7;
  buf_00->base[buf_00->off] = '\0';
  sVar22 = buf_00->off;
  sVar34 = sVar22 + 1;
  buf_00->off = sVar34;
  iVar16 = ptls_buffer__do_pushv
                     (buf_00,(tls->field_18).client.legacy_session_id.base,
                      (tls->field_18).client.legacy_session_id.len);
  if (iVar16 != 0) goto LAB_00109bd7;
  buf_00->base[sVar22] = (char)(int)buf_00->off - (char)sVar34;
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 != 0) goto LAB_00109bd7;
  puVar32 = buf_00->base;
  sVar22 = buf_00->off;
  (puVar32 + sVar22)[0] = '\0';
  (puVar32 + sVar22)[1] = '\0';
  sVar34 = buf_00->off;
  sVar22 = sVar34 + 2;
  buf_00->off = sVar22;
  pppVar20 = tls->ctx->cipher_suites;
  ppVar28 = *pppVar20;
  local_c0 = sVar22;
  while (ppVar28 != (ptls_cipher_suite_t *)0x0) {
    pppVar20 = pppVar20 + 1;
    uVar3 = ppVar28->id;
    iVar16 = ptls_buffer_reserve(buf_00,2);
    if (iVar16 != 0) goto LAB_00109bd7;
    *(ushort *)(buf_00->base + buf_00->off) = uVar3 << 8 | uVar3 >> 8;
    sVar22 = buf_00->off + 2;
    buf_00->off = sVar22;
    ppVar28 = *pppVar20;
  }
  buf_00->base[sVar34] = (uint8_t)(sVar22 - local_c0 >> 8);
  buf_00->base[sVar34 + 1] = (uint8_t)(sVar22 - local_c0);
  iVar16 = ptls_buffer_reserve(buf_00,1);
  if (iVar16 != 0) goto LAB_00109bd7;
  buf_00->base[buf_00->off] = '\0';
  sVar22 = buf_00->off;
  buf_00->off = sVar22 + 1;
  iVar16 = ptls_buffer_reserve(buf_00,1);
  if (iVar16 != 0) goto LAB_00109bd7;
  buf_00->base[buf_00->off] = '\0';
  sVar34 = buf_00->off;
  buf_00->off = sVar34 + 1;
  buf_00->base[sVar22] = (char)sVar34 - (char)sVar22;
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 != 0) goto LAB_00109bd7;
  puVar32 = buf_00->base;
  sVar22 = buf_00->off;
  (puVar32 + sVar22)[0] = '\0';
  (puVar32 + sVar22)[1] = '\0';
  local_c0 = buf_00->off;
  local_80 = local_c0 + 2;
  buf_00->off = local_80;
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 != 0) goto LAB_00109bd7;
  puVar32 = buf_00->base;
  sVar22 = buf_00->off;
  (puVar32 + sVar22)[0] = '\0';
  (puVar32 + sVar22)[1] = '3';
  buf_00->off = buf_00->off + 2;
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 != 0) goto LAB_00109bd7;
  puVar32 = buf_00->base;
  sVar22 = buf_00->off;
  (puVar32 + sVar22)[0] = '\0';
  (puVar32 + sVar22)[1] = '\0';
  sVar22 = buf_00->off;
  sVar34 = sVar22 + 2;
  buf_00->off = sVar34;
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 != 0) goto LAB_00109bd7;
  puVar32 = buf_00->base;
  sVar41 = buf_00->off;
  (puVar32 + sVar41)[0] = '\0';
  (puVar32 + sVar41)[1] = '\0';
  local_e8 = buf_00->off;
  sVar41 = local_e8 + 2;
  buf_00->off = sVar41;
  psVar8 = *local_118;
  sVar27 = sVar41;
  if (psVar8 != (st_ptls_key_exchange_algorithm_t *)0x0) {
    pppVar1 = &(tls->field_18).client.key_share_ctx;
    iVar16 = (*psVar8->create)(psVar8,pppVar1);
    if ((iVar16 != 0) ||
       (iVar16 = push_key_share_entry(buf_00,(*local_118)->id,(*pppVar1)->pubkey), iVar16 != 0))
    goto LAB_00109bd7;
    sVar27 = buf_00->off;
  }
  buf_00->base[local_e8] = (uint8_t)(sVar27 - sVar41 >> 8);
  buf_00->base[local_e8 + 1] = (uint8_t)(sVar27 - sVar41);
  server_name = (char *)(buf_00->off - sVar34);
  buf_00->base[sVar22] = (uint8_t)((ulong)server_name >> 8);
  buf_00->base[sVar22 + 1] = (uint8_t)server_name;
  if (!bVar42) {
LAB_0010a268:
    if (properties != (ptls_handshake_properties_t *)0x0) {
LAB_0010a274:
      if ((properties->field_0).client.negotiated_protocols.count != 0) {
        iVar16 = ptls_buffer_reserve(buf_00,2);
        if (iVar16 == 0) {
          puVar32 = buf_00->base;
          sVar22 = buf_00->off;
          (puVar32 + sVar22)[0] = '\0';
          (puVar32 + sVar22)[1] = '\x10';
          buf_00->off = buf_00->off + 2;
          iVar16 = ptls_buffer_reserve(buf_00,2);
          if (iVar16 == 0) {
            puVar32 = buf_00->base;
            sVar22 = buf_00->off;
            (puVar32 + sVar22)[0] = '\0';
            (puVar32 + sVar22)[1] = '\0';
            sVar22 = buf_00->off;
            local_e8 = sVar22 + 2;
            buf_00->off = local_e8;
            iVar16 = ptls_buffer_reserve(buf_00,2);
            if (iVar16 == 0) {
              puVar32 = buf_00->base;
              sVar34 = buf_00->off;
              (puVar32 + sVar34)[0] = '\0';
              (puVar32 + sVar34)[1] = '\0';
              local_c8 = buf_00->off;
              sVar34 = local_c8 + 2;
              buf_00->off = sVar34;
              local_88 = sVar34;
              if ((properties->field_0).client.negotiated_protocols.count != 0) {
                local_120 = (anon_struct_104_5_dae46d3e_for_client *)0x8;
                local_118 = (ptls_key_exchange_algorithm_t **)0x0;
                do {
                  iVar16 = ptls_buffer_reserve(buf_00,1);
                  if (iVar16 != 0) goto LAB_00109bd7;
                  buf_00->base[buf_00->off] = '\0';
                  sVar34 = buf_00->off;
                  sVar41 = sVar34 + 1;
                  buf_00->off = sVar41;
                  ppVar10 = (properties->field_0).client.negotiated_protocols.list;
                  iVar16 = ptls_buffer__do_pushv
                                     (buf_00,*(void **)((long)ppVar10 + (long)local_120 + -8),
                                      *(size_t *)((long)&ppVar10->base + (long)local_120));
                  if (iVar16 != 0) goto LAB_00109bd7;
                  buf_00->base[sVar34] = (char)(int)buf_00->off - (char)sVar41;
                  local_118 = (ptls_key_exchange_algorithm_t **)((long)local_118 + 1);
                  local_120 = (anon_struct_104_5_dae46d3e_for_client *)((long)local_120 + 0x10);
                } while (local_118 !=
                         (ptls_key_exchange_algorithm_t **)
                         (properties->field_0).client.negotiated_protocols.count);
                sVar34 = buf_00->off;
              }
              buf_00->base[local_c8] = (uint8_t)(sVar34 - local_88 >> 8);
              buf_00->base[local_c8 + 1] = (uint8_t)(sVar34 - local_88);
              lVar31 = buf_00->off - local_e8;
              buf_00->base[sVar22] = (uint8_t)((ulong)lVar31 >> 8);
              buf_00->base[sVar22 + 1] = (uint8_t)lVar31;
              goto LAB_0010a422;
            }
          }
        }
        goto LAB_00109bd7;
      }
    }
LAB_0010a422:
    if (tls->ctx->decompress_certificate == (ptls_decompress_certificate_t *)0x0) {
LAB_0010a565:
      iVar16 = ptls_buffer_reserve(buf_00,2);
      if (iVar16 == 0) {
        puVar32 = buf_00->base;
        sVar22 = buf_00->off;
        (puVar32 + sVar22)[0] = '\0';
        (puVar32 + sVar22)[1] = '+';
        buf_00->off = buf_00->off + 2;
        iVar16 = ptls_buffer_reserve(buf_00,2);
        if (iVar16 == 0) {
          puVar32 = buf_00->base;
          sVar22 = buf_00->off;
          (puVar32 + sVar22)[0] = '\0';
          (puVar32 + sVar22)[1] = '\0';
          sVar22 = buf_00->off;
          buf_00->off = sVar22 + 2;
          iVar16 = ptls_buffer_reserve(buf_00,1);
          if (iVar16 == 0) {
            buf_00->base[buf_00->off] = '\0';
            sVar34 = buf_00->off;
            sVar41 = sVar34 + 1;
            buf_00->off = sVar41;
            lVar31 = 0;
            do {
              uVar3 = *(ushort *)((long)supported_versions + lVar31);
              iVar16 = ptls_buffer_reserve(buf_00,2);
              if (iVar16 != 0) goto LAB_00109bd7;
              *(ushort *)(buf_00->base + buf_00->off) = uVar3 << 8 | uVar3 >> 8;
              sVar27 = buf_00->off + 2;
              buf_00->off = sVar27;
              lVar31 = lVar31 + 2;
            } while (lVar31 != 8);
            buf_00->base[sVar34] = (char)sVar27 - (char)sVar41;
            lVar31 = buf_00->off - (sVar22 + 2);
            buf_00->base[sVar22] = (uint8_t)((ulong)lVar31 >> 8);
            buf_00->base[sVar22 + 1] = (uint8_t)lVar31;
            iVar16 = ptls_buffer_reserve(buf_00,2);
            if (iVar16 == 0) {
              puVar32 = buf_00->base;
              sVar22 = buf_00->off;
              (puVar32 + sVar22)[0] = '\0';
              (puVar32 + sVar22)[1] = '\r';
              buf_00->off = buf_00->off + 2;
              iVar16 = ptls_buffer_reserve(buf_00,2);
              if (iVar16 == 0) {
                puVar32 = buf_00->base;
                sVar22 = buf_00->off;
                (puVar32 + sVar22)[0] = '\0';
                (puVar32 + sVar22)[1] = '\0';
                sVar22 = buf_00->off;
                buf_00->off = sVar22 + 2;
                iVar16 = push_signature_algorithms(buf_00);
                if (iVar16 == 0) {
                  lVar31 = buf_00->off - (sVar22 + 2);
                  buf_00->base[sVar22] = (uint8_t)((ulong)lVar31 >> 8);
                  buf_00->base[sVar22 + 1] = (uint8_t)lVar31;
                  iVar16 = ptls_buffer_reserve(buf_00,2);
                  if (iVar16 == 0) {
                    puVar32 = buf_00->base;
                    sVar22 = buf_00->off;
                    (puVar32 + sVar22)[0] = '\0';
                    (puVar32 + sVar22)[1] = '\n';
                    buf_00->off = buf_00->off + 2;
                    iVar16 = ptls_buffer_reserve(buf_00,2);
                    if (iVar16 == 0) {
                      puVar32 = buf_00->base;
                      sVar22 = buf_00->off;
                      (puVar32 + sVar22)[0] = '\0';
                      (puVar32 + sVar22)[1] = '\0';
                      sVar22 = buf_00->off;
                      buf_00->off = sVar22 + 2;
                      local_120 = (anon_struct_104_5_dae46d3e_for_client *)tls->ctx->key_exchanges;
                      iVar16 = ptls_buffer_reserve(buf_00,2);
                      if (iVar16 == 0) {
                        puVar32 = buf_00->base;
                        sVar34 = buf_00->off;
                        (puVar32 + sVar34)[0] = '\0';
                        (puVar32 + sVar34)[1] = '\0';
                        local_e8 = buf_00->off;
                        sVar34 = local_e8 + 2;
                        buf_00->off = sVar34;
                        ppVar11 = *(ptls_key_exchange_algorithm_t **)local_120;
                        local_c8 = sVar34;
                        while (ppVar11 != (ptls_key_exchange_algorithm_t *)0x0) {
                          local_120 = (anon_struct_104_5_dae46d3e_for_client *)((long)local_120 + 8)
                          ;
                          uVar3 = ppVar11->id;
                          iVar16 = ptls_buffer_reserve(buf_00,2);
                          if (iVar16 != 0) goto LAB_00109bd7;
                          *(ushort *)(buf_00->base + buf_00->off) = uVar3 << 8 | uVar3 >> 8;
                          sVar34 = buf_00->off + 2;
                          buf_00->off = sVar34;
                          ppVar11 = *(ptls_key_exchange_algorithm_t **)local_120;
                        }
                        buf_00->base[local_e8] = (uint8_t)(sVar34 - local_c8 >> 8);
                        buf_00->base[local_e8 + 1] = (uint8_t)(sVar34 - local_c8);
                        lVar31 = buf_00->off - (sVar22 + 2);
                        buf_00->base[sVar22] = (uint8_t)((ulong)lVar31 >> 8);
                        buf_00->base[sVar22 + 1] = (uint8_t)lVar31;
                        if ((local_d0 == (ptls_iovec_t *)0x0) || (local_d0->base == (uint8_t *)0x0))
                        {
LAB_0010a953:
                          iVar16 = push_additional_extensions(properties,buf_00);
                          if (iVar16 == 0) {
                            if (tls->ctx->save_ticket == (ptls_save_ticket_t *)0x0 &&
                                local_110 == (ushort *)0x0) {
LAB_0010aced:
                              lVar31 = buf_00->off - local_80;
                              buf_00->base[local_c0] = (uint8_t)((ulong)lVar31 >> 8);
                              buf_00->base[local_c0 + 1] = (uint8_t)lVar31;
                              sVar22 = buf->off;
                              lVar31 = 0x10;
                              do {
                                buf->base[(long)local_e0] =
                                     (uint8_t)(sVar22 - (long)local_b8 >> ((byte)lVar31 & 0x3f));
                                lVar31 = lVar31 + -8;
                                local_e0 = (ptls_cipher_suite_t **)((long)local_e0 + 1);
                              } while (lVar31 != -8);
                              iVar16 = (*emitter->commit_message)(emitter);
                              if (iVar16 == 0) {
                                if (local_110 == (ushort *)0x0) {
                                  local_120 = local_d8;
LAB_0010af2c:
                                  ppVar23 = tls->key_schedule;
                                  if (ppVar23->num_hashes != 0) {
                                    puVar32 = emitter->buf->base;
                                    sVar22 = emitter->buf->off;
                                    pppVar33 = &ppVar23->hashes[0].ctx;
                                    sVar34 = 0;
                                    do {
                                      (*(*pppVar33)->update)
                                                (*pppVar33,
                                                 local_120->record_digest + (long)(puVar32 + -0x20),
                                                 sVar22 - (long)local_120);
                                      sVar34 = sVar34 + 1;
                                      pppVar33 = pppVar33 + 2;
                                    } while (sVar34 != ppVar23->num_hashes);
                                  }
                                  if (((tls->field_18).server.pending_traffic_secret[0x38] & 2) != 0
                                     ) {
                                    if (ppVar5 != (ptls_key_schedule_t *)0x0) {
                                      __assert_fail("!is_second_flight",
                                                                                                        
                                                  "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                                                  ,0x840,
                                                  "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                                                  );
                                    }
                                    iVar16 = setup_traffic_protection(tls,1,"c e traffic",1,0);
                                    if ((iVar16 != 0) ||
                                       (iVar16 = push_change_cipher_spec(tls,emitter), iVar16 != 0))
                                    goto LAB_00109bd7;
                                  }
                                  if ((ppVar5 != (ptls_key_schedule_t *)0x0 ||
                                       local_110 == (ushort *)0x0) ||
                                     (iVar16 = derive_exporter_secret(tls,1), iVar16 == 0)) {
                                    tls->state = PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO -
                                                 (local_d0 == (ptls_iovec_t *)0x0);
                                    iVar16 = 0x202;
                                  }
                                }
                                else {
                                  sVar22 = emitter->buf->off;
                                  ppVar23 = tls->key_schedule;
                                  algo = ppVar23->hashes[0].algo;
                                  sVar34 = algo->digest_size;
                                  hash_value.len = sVar34;
                                  hash_value.base = algo->empty_digest;
                                  secret.len = sVar34;
                                  secret.base = ppVar23->secret;
                                  iVar16 = hkdf_expand_label(algo,binder_key,sVar34,secret,
                                                             "res binder",hash_value,
                                                             ppVar23->hkdf_label_prefix);
                                  if (iVar16 == 0) {
                                    local_120 = (anon_struct_104_5_dae46d3e_for_client *)
                                                ((sVar22 - sVar34) + -3);
                                    ppVar23 = tls->key_schedule;
                                    puVar32 = emitter->buf->base;
                                    if (ppVar23->num_hashes != 0) {
                                      puVar21 = local_d8->record_digest;
                                      sVar34 = (long)local_120 - (long)local_d8;
                                      pppVar33 = &ppVar23->hashes[0].ctx;
                                      sVar22 = 0;
                                      do {
                                        (*(*pppVar33)->update)
                                                  (*pppVar33,puVar21 + (long)(puVar32 + -0x20),
                                                   sVar34);
                                        sVar22 = sVar22 + 1;
                                        pppVar33 = pppVar33 + 2;
                                      } while (sVar22 != ppVar23->num_hashes);
                                      puVar32 = emitter->buf->base;
                                      ppVar23 = tls->key_schedule;
                                    }
                                    iVar16 = calc_verify_data(local_120->record_digest +
                                                              (long)(puVar32 + -0x1d),ppVar23,
                                                              binder_key);
                                    if (iVar16 == 0) goto LAB_0010af2c;
                                  }
                                }
                              }
                            }
                            else {
                              iVar16 = ptls_buffer_reserve(buf_00,2);
                              if (iVar16 == 0) {
                                puVar32 = buf_00->base;
                                sVar22 = buf_00->off;
                                (puVar32 + sVar22)[0] = '\0';
                                (puVar32 + sVar22)[1] = '-';
                                buf_00->off = buf_00->off + 2;
                                iVar16 = ptls_buffer_reserve(buf_00,2);
                                if (iVar16 == 0) {
                                  puVar32 = buf_00->base;
                                  sVar22 = buf_00->off;
                                  (puVar32 + sVar22)[0] = '\0';
                                  (puVar32 + sVar22)[1] = '\0';
                                  sVar22 = buf_00->off;
                                  buf_00->off = sVar22 + 2;
                                  iVar16 = ptls_buffer_reserve(buf_00,1);
                                  if (iVar16 == 0) {
                                    buf_00->base[buf_00->off] = '\0';
                                    sVar34 = buf_00->off;
                                    buf_00->off = sVar34 + 1;
                                    if ((tls->ctx->field_0x70 & 1) == 0) {
                                      iVar16 = ptls_buffer_reserve(buf_00,1);
                                      if (iVar16 != 0) goto LAB_00109bd7;
                                      buf_00->base[buf_00->off] = '\0';
                                      buf_00->off = buf_00->off + 1;
                                    }
                                    iVar16 = ptls_buffer_reserve(buf_00,1);
                                    if (iVar16 == 0) {
                                      buf_00->base[buf_00->off] = '\x01';
                                      sVar41 = buf_00->off;
                                      buf_00->off = sVar41 + 1;
                                      buf_00->base[sVar34] = (char)sVar41 - (char)sVar34;
                                      lVar31 = buf_00->off - (sVar22 + 2);
                                      buf_00->base[sVar22] = (uint8_t)((ulong)lVar31 >> 8);
                                      buf_00->base[sVar22 + 1] = (uint8_t)lVar31;
                                      if (local_110 == (ushort *)0x0) goto LAB_0010aced;
                                      if (((tls->field_18).server.pending_traffic_secret[0x38] & 2)
                                          == 0 || ppVar5 != (ptls_key_schedule_t *)0x0) {
LAB_0010aac0:
                                        iVar16 = ptls_buffer_reserve(buf_00,2);
                                        if (iVar16 == 0) {
                                          puVar32 = buf_00->base;
                                          sVar22 = buf_00->off;
                                          (puVar32 + sVar22)[0] = '\0';
                                          (puVar32 + sVar22)[1] = ')';
                                          buf_00->off = buf_00->off + 2;
                                          iVar16 = ptls_buffer_reserve(buf_00,2);
                                          if (iVar16 == 0) {
                                            puVar32 = buf_00->base;
                                            sVar22 = buf_00->off;
                                            (puVar32 + sVar22)[0] = '\0';
                                            (puVar32 + sVar22)[1] = '\0';
                                            sVar22 = buf_00->off;
                                            buf_00->off = sVar22 + 2;
                                            iVar16 = ptls_buffer_reserve(buf_00,2);
                                            if (iVar16 == 0) {
                                              puVar32 = buf_00->base;
                                              sVar34 = buf_00->off;
                                              (puVar32 + sVar34)[0] = '\0';
                                              (puVar32 + sVar34)[1] = '\0';
                                              sVar34 = buf_00->off;
                                              buf_00->off = sVar34 + 2;
                                              iVar16 = ptls_buffer_reserve(buf_00,2);
                                              if (iVar16 == 0) {
                                                puVar32 = buf_00->base;
                                                sVar41 = buf_00->off;
                                                (puVar32 + sVar41)[0] = '\0';
                                                (puVar32 + sVar41)[1] = '\0';
                                                sVar41 = buf_00->off;
                                                buf_00->off = sVar41 + 2;
                                                iVar16 = ptls_buffer__do_pushv
                                                                   (buf_00,resumption_ticket.base,
                                                                    resumption_ticket.len);
                                                if (iVar16 == 0) {
                                                  lVar31 = buf_00->off - (sVar41 + 2);
                                                  buf_00->base[sVar41] =
                                                       (uint8_t)((ulong)lVar31 >> 8);
                                                  buf_00->base[sVar41 + 1] = (uint8_t)lVar31;
                                                  iVar16 = ptls_buffer_reserve(buf_00,4);
                                                  if (iVar16 == 0) {
                                                    *(uint *)(buf_00->base + buf_00->off) =
                                                         uVar18 >> 0x18 | (uVar18 & 0xff0000) >> 8 |
                                                         (uVar18 & 0xff00) << 8 | uVar18 << 0x18;
                                                    sVar41 = buf_00->off + 4;
                                                    buf_00->off = sVar41;
                                                    lVar31 = sVar41 - (sVar34 + 2);
                                                    buf_00->base[sVar34] =
                                                         (uint8_t)((ulong)lVar31 >> 8);
                                                    buf_00->base[sVar34 + 1] = (uint8_t)lVar31;
                                                    iVar16 = ptls_buffer_reserve(buf_00,2);
                                                    if (iVar16 == 0) {
                                                      puVar32 = buf_00->base;
                                                      sVar34 = buf_00->off;
                                                      (puVar32 + sVar34)[0] = '\0';
                                                      (puVar32 + sVar34)[1] = '\0';
                                                      sVar34 = buf_00->off;
                                                      buf_00->off = sVar34 + 2;
                                                      iVar16 = ptls_buffer_reserve(buf_00,1);
                                                      if (iVar16 == 0) {
                                                        buf_00->base[buf_00->off] = '\0';
                                                        sVar41 = buf_00->off;
                                                        sVar27 = sVar41 + 1;
                                                        buf_00->off = sVar27;
                                                        iVar16 = ptls_buffer_reserve(buf_00,(tls->
                                                  key_schedule->hashes[0].algo)->digest_size);
                                                  if (iVar16 == 0) {
                                                    sVar30 = buf_00->off +
                                                             (tls->key_schedule->hashes[0].algo)->
                                                             digest_size;
                                                    buf_00->off = sVar30;
                                                    buf_00->base[sVar41] =
                                                         (char)sVar30 - (char)sVar27;
                                                    lVar31 = buf_00->off - (sVar34 + 2);
                                                    buf_00->base[sVar34] =
                                                         (uint8_t)((ulong)lVar31 >> 8);
                                                    buf_00->base[sVar34 + 1] = (uint8_t)lVar31;
                                                    lVar31 = buf_00->off - (sVar22 + 2);
                                                    buf_00->base[sVar22] =
                                                         (uint8_t)((ulong)lVar31 >> 8);
                                                    buf_00->base[sVar22 + 1] = (uint8_t)lVar31;
                                                    goto LAB_0010aced;
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                      else {
                                        iVar16 = ptls_buffer_reserve(buf_00,2);
                                        if (iVar16 == 0) {
                                          puVar32 = buf_00->base;
                                          sVar22 = buf_00->off;
                                          (puVar32 + sVar22)[0] = '\0';
                                          (puVar32 + sVar22)[1] = '*';
                                          buf_00->off = buf_00->off + 2;
                                          iVar16 = ptls_buffer_reserve(buf_00,2);
                                          if (iVar16 == 0) {
                                            puVar32 = buf_00->base;
                                            sVar22 = buf_00->off;
                                            (puVar32 + sVar22)[0] = '\0';
                                            (puVar32 + sVar22)[1] = '\0';
                                            sVar22 = buf_00->off;
                                            buf_00->off = sVar22 + 2;
                                            buf_00->base[sVar22] = '\0';
                                            buf_00->base[sVar22 + 1] = '\0';
                                            goto LAB_0010aac0;
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                        else {
                          iVar16 = ptls_buffer_reserve(buf_00,2);
                          if (iVar16 == 0) {
                            puVar32 = buf_00->base;
                            sVar22 = buf_00->off;
                            (puVar32 + sVar22)[0] = '\0';
                            (puVar32 + sVar22)[1] = ',';
                            buf_00->off = buf_00->off + 2;
                            iVar16 = ptls_buffer_reserve(buf_00,2);
                            if (iVar16 == 0) {
                              puVar32 = buf_00->base;
                              sVar22 = buf_00->off;
                              (puVar32 + sVar22)[0] = '\0';
                              (puVar32 + sVar22)[1] = '\0';
                              sVar22 = buf_00->off;
                              buf_00->off = sVar22 + 2;
                              iVar16 = ptls_buffer_reserve(buf_00,2);
                              if (iVar16 == 0) {
                                puVar32 = buf_00->base;
                                sVar34 = buf_00->off;
                                (puVar32 + sVar34)[0] = '\0';
                                (puVar32 + sVar34)[1] = '\0';
                                sVar34 = buf_00->off;
                                buf_00->off = sVar34 + 2;
                                iVar16 = ptls_buffer__do_pushv(buf_00,local_d0->base,local_d0->len);
                                if (iVar16 == 0) {
                                  lVar31 = buf_00->off - (sVar34 + 2);
                                  buf_00->base[sVar34] = (uint8_t)((ulong)lVar31 >> 8);
                                  buf_00->base[sVar34 + 1] = (uint8_t)lVar31;
                                  lVar31 = buf_00->off - (sVar22 + 2);
                                  buf_00->base[sVar22] = (uint8_t)((ulong)lVar31 >> 8);
                                  buf_00->base[sVar22 + 1] = (uint8_t)lVar31;
                                  goto LAB_0010a953;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      iVar16 = ptls_buffer_reserve(buf_00,2);
      if (iVar16 == 0) {
        puVar32 = buf_00->base;
        sVar22 = buf_00->off;
        (puVar32 + sVar22)[0] = '\0';
        (puVar32 + sVar22)[1] = '\x1b';
        buf_00->off = buf_00->off + 2;
        iVar16 = ptls_buffer_reserve(buf_00,2);
        if (iVar16 == 0) {
          puVar32 = buf_00->base;
          sVar22 = buf_00->off;
          (puVar32 + sVar22)[0] = '\0';
          (puVar32 + sVar22)[1] = '\0';
          sVar22 = buf_00->off;
          buf_00->off = sVar22 + 2;
          iVar16 = ptls_buffer_reserve(buf_00,1);
          if (iVar16 == 0) {
            buf_00->base[buf_00->off] = '\0';
            sVar34 = buf_00->off;
            sVar41 = sVar34 + 1;
            buf_00->off = sVar41;
            puVar35 = tls->ctx->decompress_certificate->supported_algorithms;
            uVar38 = *puVar35;
            if (uVar38 == 0xffff) {
              __assert_fail("*algo != UINT16_MAX",
                            "/workspace/llm4binary/github/license_all_cmakelists_1510/herumi[P]picotls/lib/picotls.c"
                            ,0x7f4,
                            "int send_client_hello(ptls_t *, ptls_message_emitter_t *, ptls_handshake_properties_t *, ptls_iovec_t *)"
                           );
            }
            do {
              puVar35 = puVar35 + 1;
              iVar16 = ptls_buffer_reserve(buf_00,2);
              if (iVar16 != 0) goto LAB_00109bd7;
              *(uint16_t *)(buf_00->base + buf_00->off) = uVar38 << 8 | uVar38 >> 8;
              sVar27 = buf_00->off + 2;
              buf_00->off = sVar27;
              uVar38 = *puVar35;
            } while (uVar38 != 0xffff);
            buf_00->base[sVar34] = (char)sVar27 - (char)sVar41;
            lVar31 = buf_00->off - (sVar22 + 2);
            buf_00->base[sVar22] = (uint8_t)((ulong)lVar31 >> 8);
            buf_00->base[sVar22 + 1] = (uint8_t)lVar31;
            goto LAB_0010a565;
          }
        }
      }
    }
    goto LAB_00109bd7;
  }
  if (tls->esni == (ptls_esni_secret_t *)0x0) {
    iVar16 = ptls_buffer_reserve(buf_00,2);
    if (iVar16 == 0) {
      puVar32 = buf_00->base;
      sVar22 = buf_00->off;
      (puVar32 + sVar22)[0] = '\0';
      (puVar32 + sVar22)[1] = '\0';
      buf_00->off = buf_00->off + 2;
      iVar16 = ptls_buffer_reserve(buf_00,2);
      if (iVar16 == 0) {
        puVar32 = buf_00->base;
        sVar22 = buf_00->off;
        (puVar32 + sVar22)[0] = '\0';
        (puVar32 + sVar22)[1] = '\0';
        sVar22 = buf_00->off;
        buf_00->off = sVar22 + 2;
        iVar16 = emit_server_name_extension(buf_00,tls->server_name);
        if (iVar16 == 0) {
          lVar31 = buf_00->off - (sVar22 + 2);
          buf_00->base[sVar22] = (uint8_t)((ulong)lVar31 >> 8);
          buf_00->base[sVar22 + 1] = (uint8_t)lVar31;
          goto LAB_0010a268;
        }
      }
    }
    goto LAB_00109bd7;
  }
  if (local_140 == (char *)0x0) {
LAB_0010ae5b:
    iVar16 = ptls_buffer_reserve(buf_00,2);
    if (iVar16 == 0) {
      puVar32 = buf_00->base;
      sVar22 = buf_00->off;
      (puVar32 + sVar22)[0] = 0xff;
      (puVar32 + sVar22)[1] = 0xce;
      buf_00->off = buf_00->off + 2;
      iVar16 = ptls_buffer_reserve(buf_00,2);
      if (iVar16 == 0) {
        puVar32 = buf_00->base;
        sVar22 = buf_00->off;
        (puVar32 + sVar22)[0] = '\0';
        (puVar32 + sVar22)[1] = '\0';
        sVar22 = buf_00->off;
        buf_00->off = sVar22 + 2;
        esni_keys.len = sVar34;
        esni_keys.base = (uint8_t *)tls->server_name;
        iVar16 = emit_esni_extension(tls->esni,buf_00,esni_keys,server_name,(size_t)in_R9,
                                     in_stack_fffffffffffffeb8);
        if (iVar16 == 0) {
          lVar31 = buf_00->off - (sVar22 + 2);
          buf_00->base[sVar22] = (uint8_t)((ulong)lVar31 >> 8);
          buf_00->base[sVar22 + 1] = (uint8_t)lVar31;
          goto LAB_0010a274;
        }
      }
    }
    goto LAB_00109bd7;
  }
  iVar16 = ptls_buffer_reserve(buf_00,2);
  if (iVar16 == 0) {
    puVar32 = buf_00->base;
    sVar22 = buf_00->off;
    (puVar32 + sVar22)[0] = '\0';
    (puVar32 + sVar22)[1] = '\0';
    buf_00->off = buf_00->off + 2;
    iVar16 = ptls_buffer_reserve(buf_00,2);
    if (iVar16 == 0) {
      puVar32 = buf_00->base;
      sVar22 = buf_00->off;
      (puVar32 + sVar22)[0] = '\0';
      (puVar32 + sVar22)[1] = '\0';
      sVar22 = buf_00->off;
      buf_00->off = sVar22 + 2;
      iVar16 = emit_server_name_extension(buf_00,local_140);
      if (iVar16 == 0) {
        lVar31 = buf_00->off - (sVar22 + 2);
        buf_00->base[sVar22] = (uint8_t)((ulong)lVar31 >> 8);
        buf_00->base[sVar22 + 1] = (uint8_t)lVar31;
        goto LAB_0010ae5b;
      }
    }
  }
LAB_00109bdc:
  free(local_140);
LAB_00109be1:
  (*ptls_clear_memory)(binder_key,0x40);
  return iVar16;
}

Assistant:

static int send_client_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_handshake_properties_t *properties,
                             ptls_iovec_t *cookie)
{
    ptls_iovec_t resumption_secret = {NULL}, resumption_ticket;
    char *published_sni = NULL;
    uint32_t obfuscated_ticket_age = 0;
    size_t msghash_off;
    uint8_t binder_key[PTLS_MAX_DIGEST_SIZE];
    int ret, is_second_flight = tls->key_schedule != NULL,
             send_sni = tls->server_name != NULL && !ptls_server_name_is_ipaddr(tls->server_name);

    if (properties != NULL) {
        /* try to use ESNI */
        if (!is_second_flight && send_sni && properties->client.esni_keys.base != NULL) {
            if ((ret = client_setup_esni(tls->ctx, &tls->esni, properties->client.esni_keys, &published_sni, tls->client_random)) !=
                0) {
                goto Exit;
            }
            if (tls->ctx->update_esni_key != NULL) {
                if ((ret = tls->ctx->update_esni_key->cb(tls->ctx->update_esni_key, tls, tls->esni->secret,
                                                         tls->esni->client.cipher->hash, tls->esni->esni_contents_hash)) != 0)
                    goto Exit;
            }
        }
        /* setup resumption-related data. If successful, resumption_secret becomes a non-zero value. */
        if (properties->client.session_ticket.base != NULL) {
            ptls_key_exchange_algorithm_t *key_share = NULL;
            ptls_cipher_suite_t *cipher_suite = NULL;
            uint32_t max_early_data_size;
            if (decode_stored_session_ticket(tls, &key_share, &cipher_suite, &resumption_secret, &obfuscated_ticket_age,
                                             &resumption_ticket, &max_early_data_size, properties->client.session_ticket.base,
                                             properties->client.session_ticket.base + properties->client.session_ticket.len) == 0) {
                tls->client.offered_psk = 1;
                /* key-share selected by HRR should not be overridden */
                if (tls->key_share == NULL)
                    tls->key_share = key_share;
                tls->cipher_suite = cipher_suite;
                if (!is_second_flight && max_early_data_size != 0 && properties->client.max_early_data_size != NULL) {
                    tls->client.using_early_data = 1;
                    *properties->client.max_early_data_size = max_early_data_size;
                }
            } else {
                resumption_secret = ptls_iovec_init(NULL, 0);
            }
        }
        if (tls->client.using_early_data) {
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_ACCEPTANCE_UNKNOWN;
        } else {
            if (properties->client.max_early_data_size != NULL)
                *properties->client.max_early_data_size = 0;
            properties->client.early_data_acceptance = PTLS_EARLY_DATA_REJECTED;
        }
    }

    /* use the default key share if still not undetermined */
    if (tls->key_share == NULL && !(properties != NULL && properties->client.negotiate_before_key_exchange))
        tls->key_share = tls->ctx->key_exchanges[0];

    if (!is_second_flight) {
        tls->key_schedule = key_schedule_new(tls->cipher_suite, tls->ctx->cipher_suites, tls->ctx->hkdf_label_prefix__obsolete);
        if ((ret = key_schedule_extract(tls->key_schedule, resumption_secret)) != 0)
            goto Exit;
    }

    msghash_off = emitter->buf->off + emitter->record_header_length;
    ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_CLIENT_HELLO, {
        ptls_buffer_t *sendbuf = emitter->buf;
        /* legacy_version */
        ptls_buffer_push16(sendbuf, 0x0303);
        /* random_bytes */
        ptls_buffer_pushv(sendbuf, tls->client_random, sizeof(tls->client_random));
        /* lecagy_session_id */
        ptls_buffer_push_block(
            sendbuf, 1, { ptls_buffer_pushv(sendbuf, tls->client.legacy_session_id.base, tls->client.legacy_session_id.len); });
        /* cipher_suites */
        ptls_buffer_push_block(sendbuf, 2, {
            ptls_cipher_suite_t **cs = tls->ctx->cipher_suites;
            for (; *cs != NULL; ++cs)
                ptls_buffer_push16(sendbuf, (*cs)->id);
        });
        /* legacy_compression_methods */
        ptls_buffer_push_block(sendbuf, 1, { ptls_buffer_push(sendbuf, 0); });
        /* extensions */
        ptls_buffer_push_block(sendbuf, 2, {
            struct {
                size_t off;
                size_t len;
            } key_share_client_hello;
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_KEY_SHARE, {
                key_share_client_hello.off = sendbuf->off;
                ptls_buffer_push_block(sendbuf, 2, {
                    if (tls->key_share != NULL) {
                        if ((ret = tls->key_share->create(tls->key_share, &tls->client.key_share_ctx)) != 0)
                            goto Exit;
                        if ((ret = push_key_share_entry(sendbuf, tls->key_share->id, tls->client.key_share_ctx->pubkey)) != 0)
                            goto Exit;
                    }
                });
                key_share_client_hello.len = sendbuf->off - key_share_client_hello.off;
            });
            if (send_sni) {
                if (tls->esni != NULL) {
                    if (published_sni != NULL) {
                        buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                            if ((ret = emit_server_name_extension(sendbuf, published_sni)) != 0)
                                goto Exit;
                        });
                    }
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ENCRYPTED_SERVER_NAME, {
                        if ((ret = emit_esni_extension(tls->esni, sendbuf, properties->client.esni_keys, tls->server_name,
                                                       key_share_client_hello.off, key_share_client_hello.len)) != 0)
                            goto Exit;
                    });
                } else {
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SERVER_NAME, {
                        if ((ret = emit_server_name_extension(sendbuf, tls->server_name)) != 0)
                            goto Exit;
                    });
                }
            }
            if (properties != NULL && properties->client.negotiated_protocols.count != 0) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_ALPN, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        size_t i;
                        for (i = 0; i != properties->client.negotiated_protocols.count; ++i) {
                            ptls_buffer_push_block(sendbuf, 1, {
                                ptls_iovec_t p = properties->client.negotiated_protocols.list[i];
                                ptls_buffer_pushv(sendbuf, p.base, p.len);
                            });
                        }
                    });
                });
            }
            if (tls->ctx->decompress_certificate != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COMPRESS_CERTIFICATE, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        const uint16_t *algo = tls->ctx->decompress_certificate->supported_algorithms;
                        assert(*algo != UINT16_MAX);
                        for (; *algo != UINT16_MAX; ++algo)
                            ptls_buffer_push16(sendbuf, *algo);
                    });
                });
            }
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS, {
                ptls_buffer_push_block(sendbuf, 1, {
                    size_t i;
                    for (i = 0; i != PTLS_ELEMENTSOF(supported_versions); ++i)
                        ptls_buffer_push16(sendbuf, supported_versions[i]);
                });
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SIGNATURE_ALGORITHMS, {
                if ((ret = push_signature_algorithms(sendbuf)) != 0)
                    goto Exit;
            });
            buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_SUPPORTED_GROUPS, {
                ptls_key_exchange_algorithm_t **algo = tls->ctx->key_exchanges;
                ptls_buffer_push_block(sendbuf, 2, {
                    for (; *algo != NULL; ++algo)
                        ptls_buffer_push16(sendbuf, (*algo)->id);
                });
            });
            if (cookie != NULL && cookie->base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_COOKIE, {
                    ptls_buffer_push_block(sendbuf, 2, { ptls_buffer_pushv(sendbuf, cookie->base, cookie->len); });
                });
            }
            if ((ret = push_additional_extensions(properties, sendbuf)) != 0)
                goto Exit;
            if (tls->ctx->save_ticket != NULL || resumption_secret.base != NULL) {
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PSK_KEY_EXCHANGE_MODES, {
                    ptls_buffer_push_block(sendbuf, 1, {
                        if (!tls->ctx->require_dhe_on_psk)
                            ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK);
                        ptls_buffer_push(sendbuf, PTLS_PSK_KE_MODE_PSK_DHE);
                    });
                });
            }
            if (resumption_secret.base != NULL) {
                if (tls->client.using_early_data && !is_second_flight)
                    buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_EARLY_DATA, {});
                /* pre-shared key "MUST be the last extension in the ClientHello" (draft-17 section 4.2.6) */
                buffer_push_extension(sendbuf, PTLS_EXTENSION_TYPE_PRE_SHARED_KEY, {
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 2,
                                               { ptls_buffer_pushv(sendbuf, resumption_ticket.base, resumption_ticket.len); });
                        ptls_buffer_push32(sendbuf, obfuscated_ticket_age);
                    });
                    /* allocate space for PSK binder. the space is filled at the bottom of the function */
                    ptls_buffer_push_block(sendbuf, 2, {
                        ptls_buffer_push_block(sendbuf, 1, {
                            if ((ret = ptls_buffer_reserve(sendbuf, tls->key_schedule->hashes[0].algo->digest_size)) != 0)
                                goto Exit;
                            sendbuf->off += tls->key_schedule->hashes[0].algo->digest_size;
                        });
                    });
                });
            }
        });
    });

    /* update the message hash, filling in the PSK binder HMAC if necessary */
    if (resumption_secret.base != NULL) {
        size_t psk_binder_off = emitter->buf->off - (3 + tls->key_schedule->hashes[0].algo->digest_size);
        if ((ret = derive_secret_with_empty_digest(tls->key_schedule, binder_key, "res binder")) != 0)
            goto Exit;
        ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, psk_binder_off - msghash_off);
        msghash_off = psk_binder_off;
        if ((ret = calc_verify_data(emitter->buf->base + psk_binder_off + 3, tls->key_schedule, binder_key)) != 0)
            goto Exit;
    }
    ptls__key_schedule_update_hash(tls->key_schedule, emitter->buf->base + msghash_off, emitter->buf->off - msghash_off);

    if (tls->client.using_early_data) {
        assert(!is_second_flight);
        if ((ret = setup_traffic_protection(tls, 1, "c e traffic", 1, 0)) != 0)
            goto Exit;
        if ((ret = push_change_cipher_spec(tls, emitter)) != 0)
            goto Exit;
    }
    if (resumption_secret.base != NULL && !is_second_flight) {
        if ((ret = derive_exporter_secret(tls, 1)) != 0)
            goto Exit;
    }
    tls->state = cookie == NULL ? PTLS_STATE_CLIENT_EXPECT_SERVER_HELLO : PTLS_STATE_CLIENT_EXPECT_SECOND_SERVER_HELLO;
    ret = PTLS_ERROR_IN_PROGRESS;

Exit:
    if (published_sni != NULL) {
        free(published_sni);
    }
    ptls_clear_memory(binder_key, sizeof(binder_key));
    return ret;
}